

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlVoid.cpp
# Opt level: O2

uint64 __thiscall
libebml::EbmlVoid::Overwrite
          (EbmlVoid *this,EbmlElement *EltToVoid,IOCallback *output,bool ComeBackAfterward,
          bool bWithDefault)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  uint64 uVar6;
  
  if (EltToVoid->ElementPosition != 0) {
    iVar3 = (*EltToVoid->_vptr_EbmlElement[9])(EltToVoid);
    bVar1 = EbmlElement::HeadSize(EltToVoid);
    if ((ulong)bVar1 + CONCAT44(extraout_var,iVar3) < 2) {
      uVar6 = 0;
    }
    else {
      iVar3 = (*output->_vptr_IOCallback[5])(output);
      (*output->_vptr_IOCallback[3])(output,EltToVoid->ElementPosition,0);
      iVar4 = (*EltToVoid->_vptr_EbmlElement[9])(EltToVoid);
      bVar1 = EbmlElement::HeadSize(EltToVoid);
      (this->super_EbmlBinary).super_EbmlElement.Size =
           ((ulong)bVar1 + CONCAT44(extraout_var_01,iVar4)) - 1;
      iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      iVar5 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      iVar5 = CodedSizeLength(CONCAT44(extraout_var_03,iVar5),
                              (this->super_EbmlBinary).super_EbmlElement.SizeLength,
                              (this->super_EbmlBinary).super_EbmlElement.bSizeIsFinite);
      (this->super_EbmlBinary).super_EbmlElement.Size =
           CONCAT44(extraout_var_02,iVar4) - (long)iVar5;
      iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      bVar1 = EbmlElement::HeadSize((EbmlElement *)this);
      iVar5 = (*EltToVoid->_vptr_EbmlElement[9])(EltToVoid);
      bVar2 = EbmlElement::HeadSize(EltToVoid);
      if ((ulong)bVar1 + CONCAT44(extraout_var_04,iVar4) !=
          (ulong)bVar2 + CONCAT44(extraout_var_05,iVar5)) {
        iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
        (this->super_EbmlBinary).super_EbmlElement.Size = CONCAT44(extraout_var_06,iVar4) - 1;
        iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
        iVar4 = CodedSizeLength(CONCAT44(extraout_var_07,iVar4),
                                (this->super_EbmlBinary).super_EbmlElement.SizeLength,
                                (this->super_EbmlBinary).super_EbmlElement.bSizeIsFinite);
        (this->super_EbmlBinary).super_EbmlElement.SizeLength = iVar4 + 1;
      }
      iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      if (CONCAT44(extraout_var_08,iVar4) != 0) {
        EbmlElement::RenderHead((EbmlElement *)this,output,false,bWithDefault,false);
      }
      if (ComeBackAfterward) {
        (*output->_vptr_IOCallback[3])(output,CONCAT44(extraout_var_00,iVar3),0);
      }
      iVar3 = (*EltToVoid->_vptr_EbmlElement[9])(EltToVoid);
      bVar1 = EbmlElement::HeadSize(EltToVoid);
      uVar6 = (ulong)bVar1 + CONCAT44(extraout_var_09,iVar3);
    }
    return uVar6;
  }
  return 0;
}

Assistant:

uint64 EbmlVoid::Overwrite(const EbmlElement & EltToVoid, IOCallback & output, bool ComeBackAfterward, bool bWithDefault)
{
  //  EltToVoid.UpdateSize(bWithDefault);
  if (EltToVoid.GetElementPosition() == 0) {
    // this element has never been written
    return 0;
  }
  if (EltToVoid.GetSize() + EltToVoid.HeadSize() <2) {
    // the element can't be written here !
    return 0;
  }

  uint64 CurrentPosition = output.getFilePointer();

  output.setFilePointer(EltToVoid.GetElementPosition());

  // compute the size of the voided data based on the original one
  SetSize(EltToVoid.GetSize() + EltToVoid.HeadSize() - 1); // 1 for the ID
  SetSize(GetSize() - CodedSizeLength(GetSize(), GetSizeLength(), IsFiniteSize()));
  // make sure we handle even the strange cases
  //uint32 A1 = GetSize() + HeadSize();
  //uint32 A2 = EltToVoid.GetSize() + EltToVoid.HeadSize();
  if (GetSize() + HeadSize() != EltToVoid.GetSize() + EltToVoid.HeadSize()) {
    SetSize(GetSize()-1);
    SetSizeLength(CodedSizeLength(GetSize(), GetSizeLength(), IsFiniteSize()) + 1);
  }

  if (GetSize() != 0) {
    RenderHead(output, false, bWithDefault); // the rest of the data is not rewritten
  }

  if (ComeBackAfterward) {
    output.setFilePointer(CurrentPosition);
  }

  return EltToVoid.GetSize() + EltToVoid.HeadSize();
}